

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O2

void __thiscall Blip_Buffer::mix_samples(Blip_Buffer *this,blip_sample_t *in,long count)

{
  buf_t_ *pbVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  if (this->buffer_size_ != 1) {
    pbVar1 = this->buffer_;
    uVar2 = (ulong)*(ushort *)((long)&this->offset_ + 2);
    iVar4 = 0;
    for (lVar3 = 0; count != lVar3; lVar3 = lVar3 + 1) {
      iVar5 = pbVar1[uVar2 + lVar3 + 8] - iVar4;
      iVar4 = in[lVar3] * 0x4000;
      pbVar1[uVar2 + lVar3 + 8] = iVar5 + iVar4;
    }
    pbVar1[uVar2 + lVar3 + 8] = pbVar1[uVar2 + lVar3 + 8] - iVar4;
  }
  return;
}

Assistant:

void Blip_Buffer::mix_samples( blip_sample_t const* in, long count )
{
	if ( buffer_size_ == silent_buf_size )
	{
		assert( 0 );
		return;
	}
	
	buf_t_* out = buffer_ + (offset_ >> BLIP_BUFFER_ACCURACY) + blip_widest_impulse_ / 2;
	
	int const sample_shift = blip_sample_bits - 16;
	int prev = 0;
	while ( count-- )
	{
		blip_long s = (blip_long) *in++ << sample_shift;
		*out += s - prev;
		prev = s;
		++out;
	}
	*out -= prev;
}